

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testReadTiles(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 extraout_RAX;
  ostream *in_RCX;
  char *pcVar4;
  char *pcVar5;
  char *unaff_R12;
  char *pcVar6;
  ostream *unaff_R15;
  exr_context_t f;
  int levelsy;
  int levelsx;
  int32_t ccount;
  exr_storage_t ps;
  uint64_t pchunksz;
  string fn;
  exr_chunk_info_t cinfo;
  exr_context_initializer_t cinit;
  exr_decode_pipeline_t decoder;
  undefined8 local_318;
  int local_310;
  int local_30c;
  undefined1 local_308 [4];
  int local_304;
  long local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  ostream local_2d8 [22];
  char local_2c2;
  char local_2c1;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  undefined8 local_298;
  code *pcStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  ostream local_228 [8];
  undefined8 *local_220;
  short local_218;
  long local_1b0;
  long local_1a0;
  
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_248 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_238 = 0;
  local_298 = 0x68;
  uStack_240 = 0xbf800000fffffffe;
  pcStack_290 = err_cb;
  std::__cxx11::string::append((char *)local_2f8);
  iVar1 = exr_start_read(&local_318,local_2f8[0],&local_298);
  if (iVar1 == 0) {
    iVar1 = exr_get_storage(local_318,0,&local_304);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014b6e4;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014b6fa;
    }
    if (local_304 != 1) {
      core_test_fail("EXR_STORAGE_TILED == ps",(char *)0x196,0x34eeb3,(char *)in_RCX);
      iVar1 = 0;
LAB_0014a58d:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014b739;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014b74f;
    }
    iVar1 = exr_get_chunk_count(0,0,local_308);
    if (iVar1 != 2) goto LAB_0014a58d;
    iVar1 = exr_get_chunk_count(local_318,0xffffffff,local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c6de;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c6f4;
    }
    iVar1 = exr_get_chunk_count(local_318,0xb,local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c733;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c749;
    }
    iVar1 = exr_get_chunk_count(local_318,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c788;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c79e;
    }
    iVar1 = exr_get_chunk_count(local_318,0,local_308);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0x1a1,0x34eeb3,(char *)in_RCX);
LAB_0014b996:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014b9ac:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c7dd;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c7f3;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_318,0,local_308);
    if (iVar1 != 0x12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014b996;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014b9ac;
    }
    local_30c = -1;
    in_RCX = (ostream *)&local_310;
    local_310 = -1;
    iVar1 = exr_get_tile_levels(0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c832;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c848;
    }
    iVar1 = 2;
    if (local_30c != -1) {
      pcVar4 = (char *)0x1aa;
      pcVar6 = "levelsx == -1";
LAB_0014ae98:
      core_test_fail(pcVar6,pcVar4,0x34eeb3,(char *)in_RCX);
LAB_0014aea7:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
LAB_0014bff9:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014ca85;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014ca9b;
    }
    pcVar6 = "levelsy == -1";
    if (local_310 != -1) {
      pcVar4 = (char *)0x1ab;
      goto LAB_0014ae98;
    }
    in_RCX = (ostream *)&local_310;
    iVar1 = exr_get_tile_levels(local_318,1,&local_30c);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c887;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c89d;
    }
    iVar1 = 4;
    if (local_30c != -1) {
      pcVar4 = (char *)0x1b0;
      pcVar6 = "levelsx == -1";
      goto LAB_0014ae98;
    }
    if (local_310 != -1) {
      pcVar4 = (char *)0x1b1;
      goto LAB_0014ae98;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_318,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, __null)",(char *)0x1b3,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bb71:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bb87:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, __null)",(char *)0x1b6,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bbc6:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bbdc:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, &levelsy)",(char *)0x1ba,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bc1b:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bc31:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, &levelsy)",(char *)0x1be,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bc70:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bc86:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c8dc;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c8f2;
    }
    local_30c = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_318,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bb71;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bb87;
    }
    if (local_30c != 1) {
      pcVar4 = (char *)0x1b7;
      iVar1 = 0;
      pcVar6 = "levelsx == 1";
      goto LAB_0014ae98;
    }
    in_RCX = (ostream *)&local_310;
    local_310 = -1;
    iVar1 = exr_get_tile_levels(local_318,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bbc6;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bbdc;
    }
    pcVar6 = "levelsy == 1";
    if (local_310 != 1) {
      pcVar4 = (char *)0x1bb;
      iVar1 = 0;
      goto LAB_0014ae98;
    }
    in_RCX = (ostream *)&local_310;
    local_310 = -1;
    local_30c = -1;
    iVar1 = exr_get_tile_levels(local_318,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bc1b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bc31;
    }
    iVar1 = 0;
    if (local_30c != 1) {
      pcVar4 = (char *)0x1bf;
      pcVar6 = "levelsx == 1";
      goto LAB_0014ae98;
    }
    if (local_310 != 1) {
      pcVar4 = (char *)0x1c0;
      goto LAB_0014ae98;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(0,0,0,0,0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bc70;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bc86;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_318,0,0xffffffff,0,&local_30c,&local_310);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c931;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c947;
    }
    in_RCX = (ostream *)0xffffffff;
    iVar1 = exr_get_tile_sizes(local_318,0,0,0xffffffff,&local_30c,&local_310);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c986;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c99c;
    }
    in_RCX = (ostream *)0x64;
    iVar1 = exr_get_tile_sizes(local_318,0,0,100,&local_30c,&local_310);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c9db;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014c9f1;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_318,0,100,0,&local_30c,&local_310);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014ca30;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014ca46;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_318,0,0,0,&local_30c,&local_310);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy)",(char *)0x1d1,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bf4f:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bf65:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, __null)",(char *)0x1d5,0x34eeb3,
                     (char *)in_RCX);
LAB_0014bfa4:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014bfba:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, __null, &levelsy)",(char *)0x1d8,0x34eeb3,
                     (char *)in_RCX);
      goto LAB_0014bff9;
    }
    iVar1 = 0;
    if (local_30c != 0xc) {
      pcVar4 = (char *)0x1d2;
      pcVar6 = "levelsx == 12";
      goto LAB_0014ae98;
    }
    pcVar6 = "levelsy == 24";
    if (local_310 != 0x18) {
      pcVar4 = (char *)0x1d3;
      goto LAB_0014ae98;
    }
    local_30c = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_318,0,0,0,&local_30c,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bf4f;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bf65;
    }
    if (local_30c != 0xc) {
      pcVar4 = (char *)0x1d6;
      iVar1 = 0;
      pcVar6 = "levelsx == 12";
      goto LAB_0014ae98;
    }
    local_310 = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_318,0,0,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014bfa4;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014bfba;
    }
    if (local_310 != 0x18) {
      pcVar4 = (char *)0x1d9;
      iVar1 = 0;
      goto LAB_0014ae98;
    }
    poVar2 = local_2d8;
    in_RCX = poVar2;
    iVar1 = exr_read_scanline_chunk_info(local_318,0,0x2a);
    if (iVar1 != 0x12) goto LAB_0014aea7;
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(0,0,4,2,0,0,poVar2);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cada;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014caf0;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,0xffffffff,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cb2f;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cb45;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,1,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cb84;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cb9a;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,0,4,2,0,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cbd9;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cbef;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,0,4,2,0,0xffffffff,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cc2e;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cc44;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,0,4,2,0xffffffff,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014cc83;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cc99;
    }
    in_RCX = (ostream *)0xfffffffe;
    iVar1 = exr_read_tile_chunk_info(local_318,0,4,0xfffffffe,0,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014ccd8;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014ccee;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_318,0,0xfffffffc,2,0,0,poVar2);
    if (iVar1 == 3) {
      in_RCX = (ostream *)0x2;
      iVar1 = exr_read_tile_chunk_info(local_318,0,4,2,0,0,poVar2);
      if (iVar1 == 0) {
        local_300 = 0;
        iVar1 = exr_get_chunk_unpacked_size(local_318,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c4e0;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_0014c4f6;
        }
        if (local_2c2 != '\x01') {
          pcVar6 = (char *)0x1fd;
          pcVar4 = "cinfo.type == EXR_STORAGE_TILED";
LAB_0014b3b3:
          core_test_fail(pcVar4,pcVar6,0x34eeb3,(char *)in_RCX);
          iVar1 = 0;
LAB_0014b3bf:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_0014c535;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_0014c54b;
        }
        if (local_2c1 != '\0') {
          pcVar6 = (char *)0x1fe;
          pcVar4 = "cinfo.compression == EXR_COMPRESSION_NONE";
          goto LAB_0014b3b3;
        }
        if (local_2b8 != local_300) {
          pcVar6 = (char *)0x1ff;
          pcVar4 = "cinfo.packed_size == pchunksz";
          goto LAB_0014b3b3;
        }
        if (local_2b0 != local_300) {
          pcVar6 = (char *)0x200;
          pcVar4 = "cinfo.unpacked_size == pchunksz";
          goto LAB_0014b3b3;
        }
        if (local_2a8 != 0) {
          pcVar6 = (char *)0x201;
          pcVar4 = "cinfo.sample_count_data_offset == 0";
          goto LAB_0014b3b3;
        }
        if (local_2a0 != 0) {
          pcVar6 = (char *)0x202;
          pcVar4 = "cinfo.sample_count_table_size == 0";
          goto LAB_0014b3b3;
        }
        in_RCX = local_228;
        iVar1 = exr_decoding_initialize(local_318,0,local_2d8);
        if (iVar1 != 0) goto LAB_0014b3bf;
        if (local_218 != 2) {
          pcVar4 = (char *)0x207;
          pcVar5 = "decoder.channel_count == 2";
LAB_0014b4ea:
          core_test_fail(pcVar5,pcVar4,0x34eeb3,(char *)in_RCX);
          iVar1 = 0;
LAB_0014b4f6:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_0014c58a;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0014c5a0;
        }
        iVar1 = strcmp((char *)*local_220,"G");
        if (iVar1 != 0) {
          pcVar4 = (char *)0x208;
          pcVar5 = "!strcmp (decoder.channels[0].channel_name, \"G\")";
          goto LAB_0014b4ea;
        }
        if (*(char *)((long)local_220 + 0x19) != '\x02') {
          pcVar4 = (char *)0x209;
          pcVar5 = "decoder.channels[0].bytes_per_element == 2";
          goto LAB_0014b4ea;
        }
        if (*(int *)((long)local_220 + 0xc) != 0xc) {
          pcVar4 = (char *)0x20a;
          pcVar5 = "decoder.channels[0].width == 12";
          goto LAB_0014b4ea;
        }
        if (*(int *)(local_220 + 1) != 0x18) {
          pcVar4 = (char *)0x20b;
          pcVar5 = "decoder.channels[0].height == 24";
          goto LAB_0014b4ea;
        }
        if (*(int *)(local_220 + 2) != 1) {
          pcVar4 = (char *)0x20c;
          pcVar5 = "decoder.channels[0].x_samples == 1";
          goto LAB_0014b4ea;
        }
        if (*(int *)((long)local_220 + 0x14) != 1) {
          pcVar4 = (char *)0x20d;
          pcVar5 = "decoder.channels[0].y_samples == 1";
          goto LAB_0014b4ea;
        }
        iVar1 = strcmp((char *)local_220[6],"Z");
        if (iVar1 != 0) {
          pcVar4 = (char *)0x20e;
          pcVar5 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
          goto LAB_0014b4ea;
        }
        if (*(char *)((long)local_220 + 0x49) != '\x04') {
          pcVar4 = (char *)0x20f;
          pcVar5 = "decoder.channels[1].bytes_per_element == 4";
          goto LAB_0014b4ea;
        }
        if (*(int *)((long)local_220 + 0x3c) != 0xc) {
          pcVar4 = (char *)0x210;
          pcVar5 = "decoder.channels[1].width == 12";
          goto LAB_0014b4ea;
        }
        if (*(int *)(local_220 + 7) != 0x18) {
          pcVar4 = (char *)0x211;
          pcVar5 = "decoder.channels[1].height == 24";
          goto LAB_0014b4ea;
        }
        if (*(int *)(local_220 + 8) != 1) {
          pcVar4 = (char *)0x212;
          pcVar5 = "decoder.channels[1].x_samples == 1";
          goto LAB_0014b4ea;
        }
        if (*(int *)((long)local_220 + 0x44) != 1) {
          pcVar4 = (char *)0x213;
          pcVar5 = "decoder.channels[1].y_samples == 1";
          goto LAB_0014b4ea;
        }
        poVar2 = (ostream *)operator_new__(0x240);
        pcVar6 = (char *)operator_new__(0x480);
        memset(poVar2,0,0x240);
        memset(pcVar6,0,0x480);
        local_220[5] = poVar2;
        local_220[4] = 0x1800000002;
        *(undefined2 *)((long)local_220 + 0x1c) = 2;
        local_220[0xb] = pcVar6;
        in_RCX = (ostream *)0x3000000004;
        local_220[10] = 0x3000000004;
        *(undefined2 *)((long)local_220 + 0x4c) = 4;
        iVar1 = exr_decoding_choose_default_routines(local_318,0);
        if (iVar1 != 0) goto LAB_0014b4f6;
        iVar1 = exr_decoding_run(local_318,0,local_228);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_0014c5df;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0014c5f5;
        }
        if (local_1b0 == 0) {
          if (local_1a0 != 0) {
            pcVar4 = (char *)0x229;
            pcVar5 = "decoder.unpacked_buffer == __null";
            goto LAB_0014b5ee;
          }
          if (*(short *)poVar2 != 0x33d5) goto LAB_0014b5fa;
          if (1e-06 <= ABS(*(float *)pcVar6 + -0.244778)) {
            pcVar4 = (char *)0x22e;
            pcVar5 = "fabsf (*curz - 0.244778f) < 0.000001f";
            goto LAB_0014b614;
          }
          iVar1 = exr_decoding_destroy(local_318,local_228);
          if (iVar1 == 0) {
            exr_finish(&local_318);
            operator_delete__(pcVar6);
            operator_delete__(poVar2);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            return;
          }
        }
        else {
          pcVar4 = (char *)0x227;
          pcVar5 = "decoder.packed_buffer == __null";
LAB_0014b5ee:
          core_test_fail(pcVar5,pcVar4,0x34eeb3,(char *)in_RCX);
LAB_0014b5fa:
          pcVar4 = (char *)0x22d;
          pcVar5 = "*curg == 0x33d5";
LAB_0014b614:
          core_test_fail(pcVar5,pcVar4,0x34eeb3,(char *)in_RCX);
          iVar1 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
        unaff_R12 = (char *)exr_get_default_error_message(iVar1);
        if (unaff_R12 != (char *)0x0) goto LAB_0014c634;
        std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        if ((float *)pcVar6 == (float *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1fa,0x34eeb3,
                       (char *)in_RCX);
LAB_0014c4e0:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c4f6:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x1fc,0x34eeb3,
                       (char *)in_RCX);
LAB_0014c535:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c54b:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x205,0x34eeb3,
                       (char *)in_RCX);
LAB_0014c58a:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_0014c5a0:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x222,
                       0x34eeb3,(char *)in_RCX);
LAB_0014c5df:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_0014c5f5:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x224,0x34eeb3,(char *)in_RCX);
LAB_0014c634:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
      std::ostream::put((char)unaff_R15);
      std::ostream::flush();
      core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x236,0x34eeb3,(char *)in_RCX);
      goto LAB_0014c689;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014cd43;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x192,0x34eeb3,(char *)in_RCX)
    ;
LAB_0014b6e4:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014b6fa:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_storage (f, 0, &ps)",(char *)0x195,0x34eeb3,(char *)in_RCX);
LAB_0014b739:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014b74f:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
LAB_0014c689:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0x19a,0x34eeb3,(char *)in_RCX)
    ;
LAB_0014c6de:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c6f4:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0x19c,0x34eeb3,(char *)in_RCX);
LAB_0014c733:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c749:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0x19e,0x34eeb3,(char *)in_RCX);
LAB_0014c788:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c79e:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0x1a0,0x34eeb3,(char *)in_RCX);
LAB_0014c7dd:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c7f3:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0x1a4,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c832:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c848:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (__null, 0, &levelsx, &levelsy)",(char *)0x1a9,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c887:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c89d:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (f, 1, &levelsx, &levelsy)",(char *)0x1af,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c8dc:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c8f2:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (__null, 0, 0, 0, __null, __null)",(char *)0x1c4,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c931:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c947:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy)",(char *)0x1c7,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c986:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c99c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy)",(char *)0x1ca,0x34eeb3,
                   (char *)in_RCX);
LAB_0014c9db:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014c9f1:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy)",(char *)0x1cd,0x34eeb3,
                   (char *)in_RCX);
LAB_0014ca30:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014ca46:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy)",(char *)0x1d0,0x34eeb3,
                   (char *)in_RCX);
LAB_0014ca85:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014ca9b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, &cinfo)",(char *)0x1de,0x34eeb3,
                   (char *)in_RCX);
LAB_0014cada:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014caf0:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (__null, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1e2,0x34eeb3
                   ,(char *)in_RCX);
LAB_0014cb2f:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cb45:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo)",(char *)0x1e5,0x34eeb3,
                   (char *)in_RCX);
LAB_0014cb84:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cb9a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo)",(char *)0x1e8,0x34eeb3,
                   (char *)in_RCX);
LAB_0014cbd9:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cbef:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, __null)",(char *)0x1eb,0x34eeb3,
                   (char *)in_RCX);
LAB_0014cc2e:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cc44:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo)",(char *)0x1ee,0x34eeb3,
                   (char *)in_RCX);
LAB_0014cc83:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cc99:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo)",(char *)0x1f1,0x34eeb3,
                   (char *)in_RCX);
LAB_0014ccd8:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014ccee:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo)",(char *)0x1f4,0x34eeb3,
                   (char *)in_RCX);
  }
  sVar3 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014cd43:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo)",(char *)0x1f7,0x34eeb3,
                 (char *)in_RCX);
  operator_delete__(poVar2);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}